

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_encode_se(aec_stream *strm)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  internal_state *piVar4;
  uint8_t *puVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  code *vec;
  vector_t *extraout_RAX;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  
  piVar4 = strm->state;
  iVar8 = piVar4->id_len;
  iVar7 = piVar4->bits;
  if (iVar8 < iVar7) {
    iVar7 = iVar7 - (iVar8 + 1);
    piVar4->bits = iVar7;
    *piVar4->cds = *piVar4->cds + (char)(1 << ((byte)iVar7 & 0x1f));
  }
  else {
    iVar11 = (iVar8 + 1) - iVar7;
    puVar5 = piVar4->cds;
    piVar4->cds = puVar5 + 1;
    *puVar5 = *puVar5 + (char)(1L >> ((byte)iVar11 & 0x3f));
    if (8 < iVar11) {
      iVar8 = (iVar8 - iVar7) + 9;
      do {
        iVar11 = iVar8;
        puVar5 = piVar4->cds;
        piVar4->cds = puVar5 + 1;
        *puVar5 = (uint8_t)(1 >> ((char)iVar11 - 0x10U & 0x1f));
        iVar8 = iVar11 + -8;
      } while (0x10 < iVar11 + -8);
      iVar11 = iVar11 + -0x10;
    }
    piVar4->bits = 8 - iVar11;
    *piVar4->cds = (uint8_t)(1 << ((byte)(8 - iVar11) & 0x1f));
  }
  if (piVar4->ref != 0) {
    iVar8 = piVar4->bits;
    uVar12 = piVar4->ref_sample;
    uVar1 = strm->bits_per_sample;
    if (iVar8 < (int)uVar1) {
      iVar8 = uVar1 - iVar8;
      puVar5 = piVar4->cds;
      piVar4->cds = puVar5 + 1;
      *puVar5 = *puVar5 + (char)(uVar12 >> ((byte)iVar8 & 0x3f));
      iVar7 = iVar8;
      if (8 < iVar8) {
        do {
          iVar8 = iVar7 + -8;
          puVar5 = piVar4->cds;
          piVar4->cds = puVar5 + 1;
          *puVar5 = (uint8_t)(uVar12 >> ((byte)iVar8 & 0x1f));
          bVar6 = 0x10 < iVar7;
          iVar7 = iVar8;
        } while (bVar6);
      }
      piVar4->bits = 8 - iVar8;
      *piVar4->cds = (uint8_t)(uVar12 << ((byte)(8 - iVar8) & 0x1f));
    }
    else {
      piVar4->bits = iVar8 - uVar1;
      *piVar4->cds = *piVar4->cds + (char)(uVar12 << ((byte)(iVar8 - uVar1) & 0x1f));
    }
  }
  if (strm->block_size != 0) {
    uVar9 = 0;
    do {
      uVar2 = piVar4->block[uVar9];
      uVar3 = piVar4->block[uVar9 + 1];
      uVar12 = ((uVar3 + uVar2 + 1) * (uVar3 + uVar2) >> 1) + uVar3;
      iVar8 = piVar4->bits;
      if (iVar8 <= (int)uVar12) {
        do {
          uVar12 = uVar12 - iVar8;
          puVar5 = piVar4->cds;
          piVar4->cds = puVar5 + 1;
          puVar5[1] = '\0';
          piVar4->bits = 8;
          iVar8 = 8;
        } while (7 < (int)uVar12);
      }
      piVar4->bits = ~uVar12 + iVar8;
      *piVar4->cds = *piVar4->cds + (char)(1 << ((byte)(~uVar12 + iVar8) & 0x1f));
      uVar9 = uVar9 + 2;
    } while (uVar9 < strm->block_size);
  }
  piVar4 = strm->state;
  if (piVar4->direct_out == 0) {
    piVar4->i = 0;
    vec = m_flush_block_resumable;
    piVar4->mode = m_flush_block_resumable;
  }
  else {
    lVar10 = (long)(*(int *)&piVar4->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar10;
    sVar13 = strm->avail_out - lVar10;
    strm->avail_out = sVar13;
    vec = m_get_block;
    piVar4->mode = m_get_block;
    if (((piVar4->ready_to_capture_rsi != 0) && (piVar4->blocks_avail == 0)) &&
       (vec = (code *)piVar4->offsets, (vector_t *)vec != (vector_t *)0x0)) {
      vector_push_back((vector_t *)vec,((strm->total_out - sVar13) * 8 - (long)piVar4->bits) + 8);
      piVar4->ready_to_capture_rsi = 0;
      vec = (code *)extraout_RAX;
    }
  }
  return (int)vec;
}

Assistant:

static int m_encode_se(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    emit(state, 1, state->id_len + 1);
    if (state->ref)
        emit(state, state->ref_sample, strm->bits_per_sample);

    for (size_t i = 0; i < strm->block_size; i+= 2) {
        uint32_t d = state->block[i] + state->block[i + 1];
        emitfs(state, d * (d + 1) / 2 + state->block[i + 1]);
    }

    return m_flush_block(strm);
}